

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

int poisson_sample(double a,int *seed)

{
  ostream *poVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (a <= 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"POISSON_SAMPLE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  A <= 0.\n");
    return 0;
  }
  dVar3 = uniform_01_sample(seed);
  iVar2 = 0;
  dVar4 = -a;
  dVar6 = 0.0;
  while( true ) {
    if (iVar2 == 0) {
      dVar4 = exp(-a);
      dVar5 = dVar4;
    }
    else {
      if (iVar2 == 0x65) {
        std::operator<<((ostream *)&std::cout,"\n");
        std::operator<<((ostream *)&std::cout,"POISSON_SAMPLE - Warning!\n");
        poVar1 = std::operator<<((ostream *)&std::cout,"  Exceeded KMAX = ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,100);
        std::operator<<(poVar1,"\n");
        return 100;
      }
      dVar4 = (dVar4 * a) / (double)iVar2;
      dVar5 = dVar6 + dVar4;
    }
    if ((dVar6 <= dVar3) && (dVar3 <= dVar5)) break;
    iVar2 = iVar2 + 1;
    dVar6 = dVar5;
  }
  return iVar2;
}

Assistant:

int poisson_sample ( double a, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    POISSON_SAMPLE samples the Poisson PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 February 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, the parameter of the PDF.
//    0 < A.
//
//    Input/output, int &SEED, the random number generator seed.
//
//    Output, int POISSON_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  int i;
  int KMAX = 100;
  double last;
  double next;
  double sum;
  double sumold;
//
//  Check.
//
  if ( a <= 0.0 )
  {
    cerr << "\n";
    cerr << "POISSON_SAMPLE - Fatal error!\n";
    cerr << "  A <= 0.\n";
    return 0;
  }
//
//  Pick a random value of CDF.
//
  cdf = uniform_01_sample ( seed );
//
//  Now simply start at K = 0, and find the first value for which
//  CDF(K-1) <= CDF <= CDF(K).
//
  sum = 0.0;

  for ( i = 0; i <= KMAX; i++ )
  {
    sumold = sum;

    if ( i == 0 )
    {
      next = exp ( -a );
      sum = next;
    }
    else
    {
      last = next;
      next = last * a / static_cast< double > ( i);
      sum = sum + next;
    }

    if ( sumold <= cdf && cdf <= sum )
    {
      return i;
    }

  }

  cout << "\n";
  cout << "POISSON_SAMPLE - Warning!\n";
  cout << "  Exceeded KMAX = " << KMAX << "\n";

  return KMAX;
}